

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

void __thiscall spvtools::opt::analysis::FloatConstant::~FloatConstant(FloatConstant *this)

{
  FloatConstant *this_local;
  
  ~FloatConstant(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

FloatConstant(const Float* ty, const std::vector<uint32_t>& w)
      : ScalarConstant(ty, w) {}